

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quickjs.c
# Opt level: O0

int js_get_length32(JSContext *ctx,uint32_t *pres,JSValue obj)

{
  int iVar1;
  undefined4 *in_RSI;
  JSValue JVar2;
  JSValue len_val;
  JSAtom in_stack_000000dc;
  JSContext *in_stack_000000e0;
  undefined1 in_stack_000000e8 [16];
  undefined1 in_stack_000000f8 [16];
  BOOL in_stack_00000180;
  undefined4 uVar3;
  undefined4 in_stack_ffffffffffffff8c;
  JSValueUnion JVar4;
  undefined4 local_30;
  undefined8 local_10;
  undefined8 local_8;
  
  uVar3 = 0;
  JVar2 = JS_GetPropertyInternal
                    (in_stack_000000e0,(JSValue)in_stack_000000f8,in_stack_000000dc,
                     (JSValue)in_stack_000000e8,in_stack_00000180);
  local_10 = JVar2.u;
  local_8 = (JSValueUnion)JVar2.tag;
  JVar4 = local_10;
  iVar1 = JS_IsException(JVar2);
  if (iVar1 == 0) {
    JVar2.tag = (int64_t)JVar4.ptr;
    JVar2.u.float64 = local_8;
    local_30 = JS_ToUint32Free((JSContext *)local_10,
                               (uint32_t *)CONCAT44(in_stack_ffffffffffffff8c,uVar3),JVar2);
  }
  else {
    *in_RSI = 0;
    local_30 = -1;
  }
  return local_30;
}

Assistant:

static __exception int js_get_length32(JSContext *ctx, uint32_t *pres,
                                       JSValueConst obj)
{
    JSValue len_val;
    len_val = JS_GetProperty(ctx, obj, JS_ATOM_length);
    if (JS_IsException(len_val)) {
        *pres = 0;
        return -1;
    }
    return JS_ToUint32Free(ctx, pres, len_val);
}